

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O3

SRes SzGetNextFolderItem(CSzFolder *f,CSzData *sd)

{
  byte bVar1;
  char cVar2;
  Byte *pBVar3;
  SRes SVar4;
  size_t sVar5;
  size_t sVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  CSzCoderInfo *pCVar14;
  UInt32 *value;
  CSzFolder *pCVar15;
  uint uVar16;
  UInt32 numStreams;
  Byte coderUsed [4];
  UInt32 numCoders;
  UInt32 local_64 [2];
  uint local_5c;
  ulong local_58;
  CSzFolder *local_50;
  CSzCoderInfo *local_48;
  Byte *local_40;
  uint local_34;
  ulong uVar9;
  
  local_40 = sd->Data;
  f->NumCoders = 0;
  f->NumBonds = 0;
  f->NumPackStreams = 0;
  f->UnpackStream = 0;
  SVar4 = SzReadNumber32(sd,&local_34);
  if (SVar4 != 0) {
    return SVar4;
  }
  local_58 = (ulong)local_34;
  if (local_34 - 5 < 0xfffffffc) {
    return 4;
  }
  local_48 = f->Coders;
  uVar11 = 0;
  uVar16 = 0;
  local_50 = f;
  do {
    sVar5 = sd->Size;
    if (sVar5 == 0) {
      return 0x10;
    }
    sd->Size = sVar5 - 1;
    pbVar7 = sd->Data;
    sd->Data = pbVar7 + 1;
    bVar1 = *pbVar7;
    if (0x3f < bVar1) {
      return 4;
    }
    uVar8 = bVar1 & 0xf;
    uVar9 = (ulong)uVar8;
    if (8 < uVar8) {
      return 4;
    }
    if (sVar5 - 1 < uVar9) {
      return 0x10;
    }
    if ((bVar1 & 0xf) == 0) {
      uVar12 = 0;
    }
    else {
      sVar5 = sVar5 - 2;
      pbVar7 = pbVar7 + 2;
      uVar12 = 0;
      do {
        uVar13 = uVar12 << 8;
        uVar12 = pbVar7[-1] | uVar13;
        sd->Data = pbVar7;
        sd->Size = sVar5;
        sVar5 = sVar5 - 1;
        pbVar7 = pbVar7 + 1;
        uVar8 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar8;
      } while (uVar8 != 0);
      if (uVar13 >> 0x20 != 0) {
        return 4;
      }
    }
    pCVar14 = local_48 + uVar11;
    pCVar14->MethodID = (UInt32)uVar12;
    pCVar14->NumStreams = '\x01';
    pCVar14->PropsSize = '\0';
    pCVar14->PropsOffset = 0;
    uVar8 = 1;
    if ((bVar1 & 0x10) != 0) {
      SVar4 = SzReadNumber32(sd,local_64);
      if (SVar4 != 0) {
        return SVar4;
      }
      if (7 < local_64[0]) {
        return 4;
      }
      pCVar14->NumStreams = (Byte)local_64[0];
      SVar4 = SzReadNumber32(sd,local_64);
      if (SVar4 != 0) {
        return SVar4;
      }
      if (local_64[0] != 1) {
        return 4;
      }
      uVar8 = (uint)pCVar14->NumStreams;
    }
    uVar16 = uVar16 + uVar8;
    if (7 < uVar16) {
      return 4;
    }
    if (0x1f < bVar1) {
      local_64[0] = 0;
      SVar4 = SzReadNumber32(sd,local_64);
      if (SVar4 != 0) {
        return SVar4;
      }
      uVar12 = (ulong)local_64[0];
      uVar9 = sd->Size;
      if (uVar9 < uVar12) {
        return 0x10;
      }
      if (0x7f < local_64[0]) {
        return 4;
      }
      pBVar3 = sd->Data;
      pCVar14->PropsOffset = (long)pBVar3 - (long)local_40;
      pCVar14->PropsSize = (Byte)local_64[0];
      sd->Data = pBVar3 + uVar12;
      sd->Size = uVar9 - uVar12;
    }
    pCVar15 = local_50;
    uVar8 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar8;
  } while (uVar8 != (uint)local_58);
  uVar8 = (uint)local_58 - 1;
  uVar10 = uVar16 - uVar8;
  if (uVar8 <= uVar16) {
    if (3 < uVar8) {
      return 4;
    }
    local_50->NumBonds = uVar8;
    if (4 < uVar10) {
      return 4;
    }
    local_50->NumPackStreams = uVar10;
    if (uVar16 != 0) {
      memset(local_64,0,(ulong)uVar16);
    }
    if (uVar8 == 0) {
LAB_005cb1a4:
      if (uVar10 == 1) {
        if (uVar16 == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = 0;
          while (*(char *)((long)local_64 + uVar11) != '\0') {
            uVar11 = uVar11 + 1;
            if (uVar16 == uVar11) {
              return 0x10;
            }
          }
        }
        if ((UInt32)uVar11 == uVar16) {
          return 0x10;
        }
        pCVar15->PackStreams[0] = (UInt32)uVar11;
      }
      else if (uVar16 != uVar8) {
        uVar11 = 0;
        do {
          SVar4 = SzReadNumber32(sd,&local_5c);
          uVar8 = local_5c;
          if (SVar4 != 0) {
            return SVar4;
          }
          if (uVar16 <= local_5c) {
            return 0x10;
          }
          if (*(char *)((long)local_64 + (ulong)local_5c) != '\0') {
            return 0x10;
          }
          *(undefined1 *)((long)local_64 + (ulong)local_5c) = 1;
          local_50->PackStreams[uVar11] = uVar8;
          uVar11 = uVar11 + 1;
        } while (uVar10 + (uVar10 == 0) != uVar11);
      }
      local_50->NumCoders = (UInt32)local_58;
      return 0;
    }
    local_48 = (CSzCoderInfo *)(ulong)uVar10;
    memset(&local_5c,0,local_58);
    local_40 = (Byte *)CONCAT44(local_40._4_4_,uVar8);
    uVar11 = (ulong)uVar8;
    value = &pCVar15->Bonds[0].OutIndex;
    do {
      SVar4 = SzReadNumber32(sd,value + -1);
      if (SVar4 != 0) {
        return SVar4;
      }
      uVar8 = ((CSzBond *)(value + -1))->InIndex;
      if (uVar16 <= uVar8) {
        return 0x10;
      }
      if (*(char *)((long)local_64 + (ulong)uVar8) != '\0') {
        return 0x10;
      }
      *(undefined1 *)((long)local_64 + (ulong)uVar8) = 1;
      SVar4 = SzReadNumber32(sd,value);
      if (SVar4 != 0) {
        return SVar4;
      }
      uVar8 = *value;
      if ((uint)local_58 <= uVar8) {
        return 0x10;
      }
      cVar2 = *(char *)((long)&local_5c + (ulong)uVar8);
      *(char *)((long)&local_5c + (ulong)uVar8) = cVar2 + (cVar2 == '\0');
      if (cVar2 != '\0') {
        return 0x10;
      }
      value = value + 2;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    sVar6 = 0;
    do {
      if (*(char *)((long)&local_5c + sVar6) == '\0') {
        local_50->UnpackStream = (UInt32)sVar6;
        uVar10 = (uint)local_48;
        pCVar15 = local_50;
        uVar8 = (uint)local_40;
        if ((uint)local_58 == (UInt32)sVar6) {
          return 0x10;
        }
        goto LAB_005cb1a4;
      }
      sVar6 = sVar6 + 1;
    } while (local_58 != sVar6);
  }
  return 0x10;
}

Assistant:

SRes SzGetNextFolderItem(CSzFolder *f, CSzData *sd)
{
  UInt32 numCoders, i;
  UInt32 numInStreams = 0;
  const Byte *dataStart = sd->Data;

  f->NumCoders = 0;
  f->NumBonds = 0;
  f->NumPackStreams = 0;
  f->UnpackStream = 0;
  
  RINOK(SzReadNumber32(sd, &numCoders));
  if (numCoders == 0 || numCoders > SZ_NUM_CODERS_IN_FOLDER_MAX)
    return SZ_ERROR_UNSUPPORTED;
  
  for (i = 0; i < numCoders; i++)
  {
    Byte mainByte;
    CSzCoderInfo *coder = f->Coders + i;
    unsigned idSize, j;
    UInt64 id;
    
    SZ_READ_BYTE(mainByte);
    if ((mainByte & 0xC0) != 0)
      return SZ_ERROR_UNSUPPORTED;
    
    idSize = (unsigned)(mainByte & 0xF);
    if (idSize > sizeof(id))
      return SZ_ERROR_UNSUPPORTED;
    if (idSize > sd->Size)
      return SZ_ERROR_ARCHIVE;
    id = 0;
    for (j = 0; j < idSize; j++)
    {
      id = ((id << 8) | *sd->Data);
      sd->Data++;
      sd->Size--;
    }
    if (id > (UInt32)0xFFFFFFFF)
      return SZ_ERROR_UNSUPPORTED;
    coder->MethodID = (UInt32)id;
    
    coder->NumStreams = 1;
    coder->PropsOffset = 0;
    coder->PropsSize = 0;
    
    if ((mainByte & 0x10) != 0)
    {
      UInt32 numStreams;
      
      RINOK(SzReadNumber32(sd, &numStreams));
      if (numStreams > k_NumCodersStreams_in_Folder_MAX)
        return SZ_ERROR_UNSUPPORTED;
      coder->NumStreams = (Byte)numStreams;

      RINOK(SzReadNumber32(sd, &numStreams));
      if (numStreams != 1)
        return SZ_ERROR_UNSUPPORTED;
    }

    numInStreams += coder->NumStreams;

    if (numInStreams > k_NumCodersStreams_in_Folder_MAX)
      return SZ_ERROR_UNSUPPORTED;

    if ((mainByte & 0x20) != 0)
    {
      UInt32 propsSize = 0;
      RINOK(SzReadNumber32(sd, &propsSize));
      if (propsSize > sd->Size)
        return SZ_ERROR_ARCHIVE;
      if (propsSize >= 0x80)
        return SZ_ERROR_UNSUPPORTED;
      coder->PropsOffset = sd->Data - dataStart;
      coder->PropsSize = (Byte)propsSize;
      sd->Data += (size_t)propsSize;
      sd->Size -= (size_t)propsSize;
    }
  }

  /*
  if (numInStreams == 1 && numCoders == 1)
  {
    f->NumPackStreams = 1;
    f->PackStreams[0] = 0;
  }
  else
  */
  {
    Byte streamUsed[k_NumCodersStreams_in_Folder_MAX];
    UInt32 numBonds, numPackStreams;
    
    numBonds = numCoders - 1;
    if (numInStreams < numBonds)
      return SZ_ERROR_ARCHIVE;
    if (numBonds > SZ_NUM_BONDS_IN_FOLDER_MAX)
      return SZ_ERROR_UNSUPPORTED;
    f->NumBonds = numBonds;
    
    numPackStreams = numInStreams - numBonds;
    if (numPackStreams > SZ_NUM_PACK_STREAMS_IN_FOLDER_MAX)
      return SZ_ERROR_UNSUPPORTED;
    f->NumPackStreams = numPackStreams;
  
    for (i = 0; i < numInStreams; i++)
      streamUsed[i] = False;
    
    if (numBonds != 0)
    {
      Byte coderUsed[SZ_NUM_CODERS_IN_FOLDER_MAX];

      for (i = 0; i < numCoders; i++)
        coderUsed[i] = False;
      
      for (i = 0; i < numBonds; i++)
      {
        CSzBond *bp = f->Bonds + i;
        
        RINOK(SzReadNumber32(sd, &bp->InIndex));
        if (bp->InIndex >= numInStreams || streamUsed[bp->InIndex])
          return SZ_ERROR_ARCHIVE;
        streamUsed[bp->InIndex] = True;
        
        RINOK(SzReadNumber32(sd, &bp->OutIndex));
        if (bp->OutIndex >= numCoders || coderUsed[bp->OutIndex])
          return SZ_ERROR_ARCHIVE;
        coderUsed[bp->OutIndex] = True;
      }
      
      for (i = 0; i < numCoders; i++)
        if (!coderUsed[i])
        {
          f->UnpackStream = i;
          break;
        }
      
      if (i == numCoders)
        return SZ_ERROR_ARCHIVE;
    }
    
    if (numPackStreams == 1)
    {
      for (i = 0; i < numInStreams; i++)
        if (!streamUsed[i])
          break;
      if (i == numInStreams)
        return SZ_ERROR_ARCHIVE;
      f->PackStreams[0] = i;
    }
    else
      for (i = 0; i < numPackStreams; i++)
      {
        UInt32 index;
        RINOK(SzReadNumber32(sd, &index));
        if (index >= numInStreams || streamUsed[index])
          return SZ_ERROR_ARCHIVE;
        streamUsed[index] = True;
        f->PackStreams[i] = index;
      }
  }

  f->NumCoders = numCoders;

  return SZ_OK;
}